

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O1

t_int * fiddle_perform(t_int *w)

{
  int iVar1;
  int iVar2;
  t_sigfiddle *x;
  t_float *ptVar3;
  long lVar4;
  int iVar5;
  t_float *ptVar6;
  long lVar7;
  
  x = (t_sigfiddle *)w[2];
  iVar1 = x->x_hop;
  if ((long)iVar1 != 0) {
    ptVar3 = x->x_inbuf;
    iVar2 = x->x_phase;
    ptVar6 = ptVar3 + iVar2;
    iVar5 = (int)w[3];
    if (0 < iVar5) {
      lVar4 = w[1];
      lVar7 = 0;
      do {
        *ptVar6 = *(t_float *)(lVar4 + lVar7 * 4);
        ptVar6 = ptVar6 + 1;
        lVar7 = lVar7 + 1;
      } while (iVar5 != (int)lVar7);
    }
    if (ptVar6 == ptVar3 + iVar1) {
      sigfiddle_doit(x);
      x->x_phase = 0;
      if (x->x_auto != 0) {
        clock_delay(x->x_clock,0.0);
      }
      if (x->x_nprint != 0) {
        x->x_nprint = x->x_nprint + -1;
      }
    }
    else {
      x->x_phase = iVar2 + iVar5;
    }
  }
  return w + 4;
}

Assistant:

static t_int *fiddle_perform(t_int *w)
{
    t_float *in = (t_float *)(w[1]);
    t_sigfiddle *x = (t_sigfiddle *)(w[2]);
    int n = (int)(w[3]);
    int count;
    t_float *fp;
    if (!x->x_hop)
        goto nono;
    for (count = 0, fp = x->x_inbuf + x->x_phase; count < n; count++)
        *fp++ = *in++;
    if (fp == x->x_inbuf + x->x_hop)
    {
        sigfiddle_doit(x);
        x->x_phase = 0;
        if (x->x_auto) clock_delay(x->x_clock, 0L);
        if (x->x_nprint) x->x_nprint--;
    }
    else x->x_phase += n;
nono:
    return (w+4);
}